

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O1

int Fl_Text_Editor::kf_paste(int param_1,Fl_Text_Editor *e)

{
  uint *puVar1;
  
  kill_selection(e);
  Fl::paste((Fl_Widget *)e,1);
  Fl_Text_Display::show_insert_position(&e->super_Fl_Text_Display);
  puVar1 = &(e->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.flags_;
  *(byte *)puVar1 = (byte)*puVar1 | 0x80;
  if (((e->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.when_ & 1) != 0) {
    Fl_Widget::do_callback
              ((Fl_Widget *)e,(Fl_Widget *)e,
               (e->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.user_data_);
  }
  return 1;
}

Assistant:

int Fl_Text_Editor::kf_paste(int, Fl_Text_Editor* e) {
  kill_selection(e);
  Fl::paste(*e, 1);
  e->show_insert_position();
  e->set_changed();
  if (e->when()&FL_WHEN_CHANGED) e->do_callback();
  return 1;
}